

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall
Clasp::Solver::resolveToFlagged(Solver *this,LitVec *in,uint8 vf,LitVec *out,uint32 *outLbd)

{
  SolverStrategies SVar1;
  bool bVar2;
  size_type sVar3;
  uint32 uVar4;
  uint32 uVar5;
  size_type sVar6;
  Antecedent *this_00;
  const_reference pLVar7;
  reference pLVar8;
  reference __b;
  int iVar9;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RCX;
  byte in_DL;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  Solver *in_RDI;
  int *in_R8;
  Var v_2;
  Var v_1;
  uint32 root;
  uint32 dl;
  uint32 i_1;
  size_type i;
  uint32 antes;
  uint32 ccAct;
  size_type outSize;
  const_iterator end;
  const_iterator it;
  Var v;
  Literal p;
  size_type resolve;
  size_type tp;
  bool first;
  bool ok;
  LitVec temp;
  LitVec *rhs;
  LitVec *trail;
  undefined4 in_stack_fffffffffffffe48;
  Var in_stack_fffffffffffffe4c;
  Literal in_stack_fffffffffffffe50;
  Literal in_stack_fffffffffffffe54;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  undefined4 in_stack_fffffffffffffe60;
  Literal in_stack_fffffffffffffe64;
  Solver *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  Literal in_stack_fffffffffffffe74;
  bool local_185;
  CCMinRecursive *in_stack_fffffffffffffec8;
  Var in_stack_fffffffffffffed4;
  Solver *in_stack_fffffffffffffed8;
  Literal in_stack_fffffffffffffee0;
  bool local_11a;
  int local_b8;
  size_type local_b0;
  size_type local_a8;
  size_type local_9c;
  VarInfo local_91;
  uint32 local_90;
  uint32 local_8c;
  uint32 local_88;
  VarInfo local_81;
  uint32 local_80;
  uint32 local_7c;
  const_iterator local_78;
  const_iterator local_70;
  Var local_68;
  Literal local_64;
  int local_60;
  size_type local_5c;
  byte local_56;
  byte local_55;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> local_48;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_38;
  Assignment *local_30;
  int *local_28;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_20;
  byte local_11;
  
  local_30 = &in_RDI->assign_;
  local_38 = in_RSI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_11 = in_DL;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
             CONCAT44(in_stack_fffffffffffffe74.rep_,in_stack_fffffffffffffe70));
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear(local_20);
  local_55 = 1;
  local_56 = 1;
  local_5c = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                       (&local_30->trail);
  local_60 = 0;
  do {
    Literal::Literal(&local_64);
    local_70 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin(local_38);
    local_78 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(local_38);
    for (; local_70 != local_78; local_70 = local_70 + 1) {
      local_80 = local_70->rep_;
      local_7c = (uint32)operator^(in_stack_fffffffffffffe50,
                                   SUB41(in_stack_fffffffffffffe4c >> 0x18,0));
      local_64 = (Literal)local_7c;
      local_68 = Literal::var(&local_64);
      bVar2 = seen((Solver *)CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_)
                   ,in_stack_fffffffffffffe4c);
      if (!bVar2) {
        markSeen((Solver *)CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                 in_stack_fffffffffffffe4c);
        local_81 = varInfo((Solver *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                           in_stack_fffffffffffffe54.rep_);
        bVar2 = VarInfo::hasAll(&local_81,(uint)local_11);
        if (bVar2) {
          level((Solver *)CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                in_stack_fffffffffffffe4c);
          markLevel((Solver *)
                    CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                    in_stack_fffffffffffffe4c);
          local_88 = (uint32)Literal::operator~((Literal *)
                                                CONCAT44(in_stack_fffffffffffffe4c,
                                                         in_stack_fffffffffffffe48));
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                     CONCAT44(in_stack_fffffffffffffe64.rep_,in_stack_fffffffffffffe60),
                     (Literal *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        }
        else {
          local_8c = local_64.rep_;
          this_00 = reason((Solver *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           in_stack_fffffffffffffe54);
          bVar2 = Antecedent::isNull(this_00);
          if (bVar2) {
            clearSeen((Solver *)
                      CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                      in_stack_fffffffffffffe4c);
            local_55 = 0;
            break;
          }
          local_60 = local_60 + 1;
        }
      }
    }
    iVar9 = local_60 + -1;
    bVar2 = local_60 == 0;
    local_60 = iVar9;
    if (bVar2) {
      local_9c = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_20)
      ;
      if (((local_55 & 1) != 0) && ((local_56 & 1) == 0)) {
        SVar1 = in_RDI->strategy_;
        in_RDI->strategy_ =
             (SolverStrategies)((ulong)in_RDI->strategy_ & 0xffffbfffffffffff | 0x400000000000);
        if (in_RDI->ccMin_ != (CCMinRecursive *)0x0) {
          ccMinRecurseInit((Solver *)
                           CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                           (CCMinRecursive *)
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        local_a8 = 0;
        while (local_a8 != local_9c) {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                    (local_20,local_a8);
          Literal::operator~((Literal *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          bVar2 = ccRemovable(in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            pLVar8 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                               (local_20,local_a8);
            local_9c = local_9c - 1;
            __b = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                            (local_20,local_9c);
            std::swap<Clasp::Literal>(pLVar8,__b);
          }
          else {
            local_a8 = local_a8 + 1;
          }
        }
        in_RDI->strategy_ =
             (SolverStrategies)
             ((ulong)in_RDI->strategy_ & 0xffffbfffffffffff |
             (ulong)(SVar1._4_4_ >> 0xe & 1) << 0x2e);
      }
      if (((local_55 & 1) != 0) && (local_9c == 0)) {
        sVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_20);
        Potassco::fail(-1,
                       "bool Clasp::Solver::resolveToFlagged(const LitVec &, const uint8, LitVec &, uint32 &)"
                       ,0x48a,"!ok || outSize != 0","Invalid empty clause - was %u!\n",(ulong)sVar3,
                       0);
      }
      *local_28 = 0;
      local_b8 = 0;
      for (local_b0 = 0; local_b0 != local_9c; local_b0 = local_b0 + 1) {
        pLVar8 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                           (local_20,local_b0);
        Literal::var(pLVar8);
        uVar4 = level((Solver *)
                      CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                      in_stack_fffffffffffffe4c);
        clearSeen((Solver *)CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                  in_stack_fffffffffffffe4c);
        if ((uVar4 != 0) &&
           (bVar2 = hasLevel((Solver *)
                             CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_)
                             ,in_stack_fffffffffffffe4c), bVar2)) {
          unmarkLevel((Solver *)
                      CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                      in_stack_fffffffffffffe4c);
          uVar5 = rootLevel(in_RDI);
          local_185 = true;
          if (uVar4 <= uVar5) {
            local_b8 = local_b8 + 1;
            local_185 = local_b8 == 1;
          }
          *local_28 = (uint)local_185 + *local_28;
        }
      }
      while (sVar3 = local_9c,
            sVar6 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                              (local_20), sVar3 != sVar6) {
        pLVar8 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back(local_20)
        ;
        Literal::var(pLVar8);
        clearSeen((Solver *)CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                  in_stack_fffffffffffffe4c);
        level((Solver *)CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
              in_stack_fffffffffffffe4c);
        unmarkLevel((Solver *)
                    CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
                    in_stack_fffffffffffffe4c);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pop_back(local_20);
      }
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1ecd8a);
      return (bool)(local_55 & 1);
    }
    do {
      local_5c = local_5c - 1;
      pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         (&local_30->trail,local_5c);
      local_90 = pLVar7->rep_;
      bVar2 = seen((Solver *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                   in_stack_fffffffffffffe64);
      local_11a = true;
      if (bVar2) {
        in_stack_fffffffffffffed8 =
             (Solver *)
             bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (&local_30->trail,local_5c);
        in_stack_fffffffffffffed4 = Literal::var((Literal *)in_stack_fffffffffffffed8);
        local_91 = varInfo((Solver *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                           in_stack_fffffffffffffe54.rep_);
        local_11a = VarInfo::hasAll(&local_91,(uint)local_11);
      }
    } while (local_11a != false);
    in_stack_fffffffffffffec8 =
         (CCMinRecursive *)
         bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                   (&local_30->trail,local_5c);
    local_64.rep_ = *(uint32 *)&(in_stack_fffffffffffffec8->todo).ebo_.buf;
    Literal::var(&local_64);
    clearSeen((Solver *)CONCAT44(in_stack_fffffffffffffe54.rep_,in_stack_fffffffffffffe50.rep_),
              in_stack_fffffffffffffe4c);
    reason(in_stack_fffffffffffffe68,in_stack_fffffffffffffe74,
           (LitVec *)CONCAT44(in_stack_fffffffffffffe64.rep_,in_stack_fffffffffffffe60));
    local_38 = &local_48;
    local_56 = 0;
  } while( true );
}

Assistant:

bool Solver::resolveToFlagged(const LitVec& in, const uint8 vf, LitVec& out, uint32& outLbd) {
	const LitVec& trail = assign_.trail;
	const LitVec* rhs   = &in;
	LitVec temp; out.clear();
	bool ok = true, first = true;
	for (LitVec::size_type tp = trail.size(), resolve = 0;; first = false) {
		Literal p; Var v;
		for (LitVec::const_iterator it = rhs->begin(), end = rhs->end(); it != end; ++it) {
			p = *it ^ first; v = p.var();
			if (!seen(v)) {
				markSeen(v);
				if      (varInfo(v).hasAll(vf)) { markLevel(level(v)); out.push_back(~p); }
				else if (!reason(p).isNull())   { ++resolve; }
				else                            { clearSeen(v); ok = false; break; }
			}
		}
		if (resolve-- == 0) { break; }
		// find next literal to resolve
		while (!seen(trail[--tp]) || varInfo(trail[tp].var()).hasAll(vf)) { ; }
		clearSeen((p = trail[tp]).var());
		reason(p, temp);
		rhs = &temp;
	}
	LitVec::size_type outSize = out.size();
	if (ok && !first) {
		const uint32 ccAct = strategy_.ccMinKeepAct;
		const uint32 antes = SolverStrategies::all_antes;
		strategy_.ccMinKeepAct = 1;
		if (ccMin_) { ccMinRecurseInit(*ccMin_); }
		for (LitVec::size_type i = 0; i != outSize;) {
			if (!ccRemovable(~out[i], antes, ccMin_)) { ++i; }
			else {
				std::swap(out[i], out[--outSize]);
			}
		}
		strategy_.ccMinKeepAct = ccAct;
	}
	POTASSCO_ASSERT(!ok || outSize != 0, "Invalid empty clause - was %u!\n", out.size());
	outLbd = 0;
	for (uint32 i = 0, dl, root = 0; i != outSize; ++i) {
		Var v = out[i].var();
		dl    = level(v);
		clearSeen(v);
		if (dl && hasLevel(dl)) {
			unmarkLevel(dl);
			outLbd += (dl > rootLevel()) || (++root == 1);
		}
	}
	for (Var v; outSize != out.size(); out.pop_back()) {
		clearSeen(v = out.back().var());
		unmarkLevel(level(v));
	}
	return ok;
}